

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O0

int Lodtalk::CompiledMethod::stObjectAtPut(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SmallIntegerValue SVar4;
  size_t sVar5;
  uint8_t *puVar6;
  SmallIntegerValue index;
  Oop valueOop;
  Oop indexOop;
  CompiledMethod *self;
  Oop selfOop;
  InterpreterProxy *interpreter_local;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 2) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])();
    valueOop.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    valueOop.field_0.uintValue._4_4_ = extraout_var_01;
    iVar3 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
    bVar1 = Oop::isSmallInteger(&valueOop);
    if (bVar1) {
      SVar4 = Oop::decodeSmallInteger(&valueOop);
      if ((0 < SVar4) &&
         (sVar5 = getLiteralCount((CompiledMethod *)CONCAT44(extraout_var_00,iVar2)),
         SVar4 <= (long)(sVar5 + 1))) {
        puVar6 = ProtoObject::getFirstFieldPointer((ProtoObject *)CONCAT44(extraout_var_00,iVar2));
        *(ulong *)(puVar6 + (SVar4 + -1) * 8) = CONCAT44(extraout_var_02,iVar3);
        iVar2 = (*interpreter->_vptr_InterpreterProxy[0x17])
                          (interpreter,CONCAT44(extraout_var_02,iVar3));
        return iVar2;
      }
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
    }
    else {
      interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
    }
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int CompiledMethod::stObjectAtPut(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 2)
        return interpreter->primitiveFailed();

    auto selfOop = interpreter->getReceiver();
    auto self = reinterpret_cast<CompiledMethod*> (selfOop.pointer);

    auto indexOop = interpreter->getTemporary(0);
    auto valueOop = interpreter->getTemporary(1);
    if (!indexOop.isSmallInteger())
        return interpreter->primitiveFailed();

    auto index = indexOop.decodeSmallInteger();
    if (index < 1 || index > (SmallIntegerValue)self->getLiteralCount() + 1)
        return interpreter->primitiveFailed();

    reinterpret_cast<Oop*> (self->getFirstFieldPointer())[index - 1] = valueOop;
    return interpreter->returnOop(valueOop);
}